

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O3

void helper_v7m_vlldm_aarch64(CPUARMState_conflict *env,uint32_t fptr)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uintptr_t unaff_retaddr;
  
  uVar6 = (ulong)(env->v7m).secure;
  if (uVar6 == 0) {
    __assert_fail("env->v7m.secure",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                  ,0x407,"void helper_v7m_vlldm_aarch64(CPUARMState *, uint32_t)");
  }
  uVar7 = (env->v7m).control[1];
  if ((uVar7 & 8) == 0) {
    return;
  }
  if ((env->features & 0x200) == 0) {
    if (env->aarch64 == 0) {
      uVar5 = env->uncached_cpsr & 0x1f;
      if (uVar5 == 0x10) {
        uVar5 = 0;
LAB_00623a08:
        switch((env->v7m).cpacr[1] >> 0x14 & 3) {
        case 1:
switchD_006239f8_caseD_1:
          if (uVar5 != 0) goto switchD_006239f8_caseD_3;
          break;
        case 3:
switchD_006239f8_caseD_3:
          uVar5 = (env->v7m).fpccr[1];
          if ((uVar5 & 1) != 0) {
            (env->v7m).fpccr[1] = uVar5 & 0xfffffffe;
LAB_00623b8a:
            (env->v7m).control[1] = uVar7 | 4;
            return;
          }
          if ((fptr & 7) == 0) {
            uVar8 = 0;
            uVar7 = 0;
            uVar4 = fptr;
            do {
              uVar1 = uVar4;
              if (0xf < uVar7) {
                uVar1 = uVar4 + 8;
              }
              uVar2 = cpu_ldl_data_ra_aarch64(env,(ulong)uVar1,unaff_retaddr);
              uVar3 = cpu_ldl_data_ra_aarch64(env,(ulong)(uVar1 | 4),unaff_retaddr);
              (env->vfp).zregs[uVar7 >> 2].d[uVar8 & 1] = CONCAT44(uVar3,uVar2);
              uVar7 = uVar7 + 2;
              uVar8 = uVar8 + 1;
              uVar4 = uVar4 + 8;
            } while (uVar7 < (uVar5 >> 0x16 & 0x10) + 0x10);
            uVar4 = cpu_ldl_data_ra_aarch64(env,(ulong)(fptr + 0x40),unaff_retaddr);
            vfp_set_fpscr_aarch64(env,uVar4);
            uVar7 = (env->v7m).control[1];
            goto LAB_00623b8a;
          }
          uVar4 = 0x16;
          goto LAB_00623bff;
        }
      }
      else if (uVar5 == 0x16) {
        uVar5 = 1;
        switch((env->v7m).cpacr[1] >> 0x14 & 3) {
        case 1:
          goto switchD_006239f8_caseD_1;
        case 3:
          goto switchD_006239f8_caseD_3;
        }
      }
      else {
        if (uVar5 != 0x1a) {
          uVar5 = 1;
          goto LAB_00623a08;
        }
        uVar5 = 1;
        switch((env->v7m).cpacr[1] >> 0x14 & 3) {
        case 1:
          goto switchD_006239f8_caseD_1;
        case 3:
          goto switchD_006239f8_caseD_3;
        }
      }
    }
    else {
      uVar5 = env->pstate >> 2 & 3;
      switch((env->v7m).cpacr[1] >> 0x14 & 3) {
      case 1:
        goto switchD_006239f8_caseD_1;
      case 3:
        goto switchD_006239f8_caseD_3;
      }
    }
  }
  else {
    uVar5 = 1;
    if ((env->v7m).exception != 0) goto LAB_00623a08;
    uVar5 = ~(env->v7m).control[uVar6] & 1;
    switch((env->v7m).cpacr[1] >> 0x14 & 3) {
    case 1:
      goto switchD_006239f8_caseD_1;
    case 3:
      goto switchD_006239f8_caseD_3;
    }
  }
  uVar4 = 0x11;
LAB_00623bff:
  raise_exception_ra_aarch64(env,uVar4,0,1,unaff_retaddr);
}

Assistant:

void HELPER(v7m_vlldm)(CPUARMState *env, uint32_t fptr)
{
    uintptr_t ra = GETPC();

    /* fptr is the value of Rn, the frame pointer we load the FP regs from */
    assert(env->v7m.secure);

    if (!(env->v7m.control[M_REG_S] & R_V7M_CONTROL_SFPA_MASK)) {
        return;
    }

    /* Check access to the coprocessor is permitted */
    if (!v7m_cpacr_pass(env, true, arm_current_el(env) != 0)) {
        raise_exception_ra(env, EXCP_NOCP, 0, 1, GETPC());
    }

    if (env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_LSPACT_MASK) {
        /* State in FP is still valid */
        env->v7m.fpccr[M_REG_S] &= ~R_V7M_FPCCR_LSPACT_MASK;
    } else {
        bool ts = env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_TS_MASK;
        int i;
        uint32_t fpscr;

        if (fptr & 7) {
            raise_exception_ra(env, EXCP_UNALIGNED, 0, 1, GETPC());
        }

        for (i = 0; i < (ts ? 32 : 16); i += 2) {
            uint32_t slo, shi;
            uint64_t dn;
            uint32_t faddr = fptr + 4 * i;

            if (i >= 16) {
                faddr += 8; /* skip the slot for the FPSCR */
            }

            slo = cpu_ldl_data_ra(env, faddr, ra);
            shi = cpu_ldl_data_ra(env, faddr + 4, ra);

            dn = (uint64_t) shi << 32 | slo;
            *aa32_vfp_dreg(env, i / 2) = dn;
        }
        fpscr = cpu_ldl_data_ra(env, fptr + 0x40, ra);
        vfp_set_fpscr(env, fpscr);
    }

    env->v7m.control[M_REG_S] |= R_V7M_CONTROL_FPCA_MASK;
}